

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLLoader.cpp
# Opt level: O1

void sfogl_LoadFunctions(void)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  
  sfogl_ext_SGIS_texture_edge_clamp = 0;
  sfogl_ext_EXT_texture_edge_clamp = 0;
  sfogl_ext_EXT_blend_minmax = 0;
  sfogl_ext_EXT_blend_subtract = 0;
  sfogl_ext_ARB_multitexture = 0;
  sfogl_ext_EXT_blend_func_separate = 0;
  sfogl_ext_ARB_vertex_buffer_object = 0;
  sfogl_ext_ARB_shading_language_100 = 0;
  sfogl_ext_ARB_shader_objects = 0;
  sfogl_ext_ARB_vertex_shader = 0;
  sfogl_ext_ARB_fragment_shader = 0;
  sfogl_ext_ARB_texture_non_power_of_two = 0;
  sfogl_ext_EXT_blend_equation_separate = 0;
  sfogl_ext_EXT_texture_sRGB = 0;
  sfogl_ext_EXT_framebuffer_object = 0;
  sfogl_ext_EXT_packed_depth_stencil = 0;
  sfogl_ext_EXT_framebuffer_blit = 0;
  sfogl_ext_EXT_framebuffer_multisample = 0;
  sfogl_ext_ARB_copy_buffer = 0;
  sfogl_ext_ARB_geometry_shader4 = 0;
  lVar4 = 0x10;
  do {
    bVar2 = sf::Context::isExtensionAvailable
                      (*(char **)((long)&sf::Transformable::typeinfo + lVar4));
    if (bVar2) {
      pcVar1 = *(code **)((long)&ExtensionMap[0].extensionName + lVar4);
      if (pcVar1 == (code *)0x0) {
        iVar3 = 1;
      }
      else {
        iVar3 = (*pcVar1)();
        iVar3 = iVar3 + 1;
      }
      **(int **)((long)&PTR_typeinfo_name_0022b5e8 + lVar4) = iVar3;
    }
    lVar4 = lVar4 + 0x18;
  } while (lVar4 != 0x1f0);
  return;
}

Assistant:

void sfogl_LoadFunctions()
{
    ClearExtensionVars();

    for (int i = 0; i < g_extensionMapSize; ++i)
    {
        if (sf::Context::isExtensionAvailable(ExtensionMap[i].extensionName))
            LoadExtension(ExtensionMap[i]);
    }
}